

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

void __thiscall
rsg::ComputeAddRange::operator()
          (ComputeAddRange *this,Random *random,float dstMin,float dstMax,float *aMin,float *aMax,
          float *bMin,float *bMax)

{
  float fVar1;
  GetRandom local_51 [8];
  GetRandom local_49;
  float aOffset;
  float local_44;
  float subRangeLen;
  float rangeLen;
  float *bMax_local;
  float *bMin_local;
  float *aMax_local;
  float *aMin_local;
  float dstMax_local;
  float dstMin_local;
  Random *random_local;
  ComputeAddRange *this_local;
  
  local_44 = dstMax - dstMin;
  _subRangeLen = bMax;
  bMax_local = bMin;
  bMin_local = aMax;
  aMax_local = aMin;
  aMin_local._0_4_ = dstMax;
  aMin_local._4_4_ = dstMin;
  _dstMax_local = random;
  random_local = (Random *)this;
  aOffset = operator()<float>::GetRandom::operator()(&local_49,random,0.0,local_44);
  fVar1 = operator()<float>::GetRandom::operator()(local_51,_dstMax_local,-8.0,8.0);
  *aMax_local = aMin_local._4_4_ + fVar1;
  *bMin_local = *aMax_local + aOffset;
  *bMax_local = -fVar1;
  *_subRangeLen = -fVar1 + (local_44 - aOffset);
  return;
}

Assistant:

void ComputeAddRange::operator() (de::Random& random, T dstMin, T dstMax, T& aMin, T& aMax, T& bMin, T& bMax) const
{
	struct GetRandom
	{
		int		operator() (de::Random& rnd, int min, int max) const		{ return rnd.getInt(min, max); }
		float	operator() (de::Random& rnd, float min, float max) const	{ return getQuantizedFloat(rnd, min, max, 0.5f); }
	};

	T rangeLen		= dstMax-dstMin;
	T subRangeLen	= GetRandom()(random, T(0), rangeLen);
	T aOffset		= GetRandom()(random, T(-8), T(8));

	aMin			= dstMin+aOffset;
	aMax			= aMin+subRangeLen;

	bMin			= -aOffset;
	bMax			= -aOffset+(rangeLen-subRangeLen);

#if defined(DE_DEBUG)
	T eps = T(0.001);
	DE_ASSERT(aMin <= aMax && bMin <= bMax);
	DE_ASSERT(de::inRange(aMin+bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMin+bMax, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax+bMin, dstMin-eps, dstMax+eps));
	DE_ASSERT(de::inRange(aMax+bMax, dstMin-eps, dstMax+eps));
#endif
}